

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void libtorrent::aux::anon_unknown_135::pick_busy_blocks
               (piece_picker *picker,piece_index_t piece,int blocks_in_piece,int timed_out,
               vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               *interesting_blocks,downloading_piece *pi)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *this;
  undefined1 *puVar4;
  long lVar5;
  busy_block_t *__i;
  undefined8 *puVar6;
  int *__args_1;
  undefined1 *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  span<const_libtorrent::aux::piece_picker::block_info> sVar12;
  undefined1 auStack_48 [8];
  vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *local_40;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_38;
  int local_34;
  piece_index_t piece_local;
  
  puVar7 = auStack_48;
  local_40 = (vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
             interesting_blocks;
  local_38.m_val = piece.m_val;
  local_34 = blocks_in_piece;
  if (blocks_in_piece < 0x201) {
    if (blocks_in_piece < 1) {
      puVar4 = (undefined1 *)0x0;
      puVar7 = auStack_48;
    }
    else {
      puVar4 = auStack_48 + -((ulong)(uint)blocks_in_piece * 8 + 0xf & 0xfffffffffffffff0);
      puVar7 = puVar4;
    }
  }
  else {
    puVar4 = (undefined1 *)operator_new__((ulong)(uint)blocks_in_piece << 3);
  }
  *(undefined8 *)(puVar7 + -8) = 0x32c571;
  sVar12 = piece_picker::blocks_for_piece(picker,pi);
  if (sVar12.m_len != 0) {
    lVar5 = 0;
    iVar8 = 0;
    iVar10 = 0;
    do {
      uVar9 = (uint)*(ushort *)(&(sVar12.m_ptr)->field_0x8 + lVar5);
      if (((uVar9 & 0xc000) == 0x4000) && (uVar9 = uVar9 & 0x3fff, (int)uVar9 <= timed_out)) {
        *(uint *)(puVar4 + (long)iVar10 * 8) = uVar9;
        *(int *)(puVar4 + (long)iVar10 * 8 + 4) = iVar8;
        iVar10 = iVar10 + 1;
      }
      iVar8 = iVar8 + 1;
      lVar5 = lVar5 + 0x10;
    } while (sVar12.m_len * 0x10 != lVar5);
    if (iVar10 != 0) {
      uVar11 = (ulong)iVar10;
      puVar1 = (undefined8 *)(puVar4 + uVar11 * 8);
      lVar5 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      *(undefined8 *)(puVar7 + -8) = 0x32c5ea;
      ::std::
      __introsort_loop<libtorrent::aux::(anonymous_namespace)::busy_block_t*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar4,puVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if (iVar10 < 0x11) {
        *(undefined8 *)(puVar7 + -8) = 0x32c641;
        ::std::
        __insertion_sort<libtorrent::aux::(anonymous_namespace)::busy_block_t*,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar4,puVar1);
      }
      else {
        puVar6 = (undefined8 *)(puVar4 + 0x80);
        *(undefined8 *)(puVar7 + -8) = 0x32c602;
        ::std::
        __insertion_sort<libtorrent::aux::(anonymous_namespace)::busy_block_t*,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar4,puVar6);
        do {
          uVar2 = *puVar6;
          iVar8 = *(int *)(puVar6 + -1);
          puVar3 = puVar6;
          while ((int)uVar2 < iVar8) {
            *puVar3 = puVar3[-1];
            iVar8 = *(int *)(puVar3 + -2);
            puVar3 = puVar3 + -1;
          }
          *puVar3 = uVar2;
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar1);
        if (iVar10 == 0) goto LAB_0032c666;
      }
      lVar5 = uVar11 << 3;
      __args_1 = (int *)(puVar4 + 4);
      do {
        this = local_40;
        *(undefined8 *)(puVar7 + -8) = 0x32c65c;
        ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
        emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int_const&>
                  (this,&local_38,__args_1);
        __args_1 = __args_1 + 2;
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
  }
LAB_0032c666:
  if (puVar4 != (undefined1 *)0x0 && 0x200 < local_34) {
    *(undefined8 *)(puVar7 + -8) = 0x32c682;
    operator_delete__(puVar4);
  }
  return;
}

Assistant:

void pick_busy_blocks(piece_picker const* picker
		, piece_index_t const piece
		, int const blocks_in_piece
		, int const timed_out
		, std::vector<piece_block>& interesting_blocks
		, piece_picker::downloading_piece const& pi)
	{
		// if there aren't any free blocks in the piece, and the piece is
		// old enough, we may switch into busy mode for this piece. In this
		// case busy_blocks and busy_count are set to contain the eligible
		// busy blocks we may pick
		// first, figure out which blocks are eligible for picking
		// in "busy-mode"
		TORRENT_ALLOCA(busy_blocks, busy_block_t, blocks_in_piece);
		int busy_count = 0;

		// pick busy blocks from the piece
		int idx = -1;
		for (auto const& info : picker->blocks_for_piece(pi))
		{
			++idx;
			// only consider blocks that have been requested
			// and we're still waiting for them
			if (info.state != piece_picker::block_info::state_requested)
				continue;

			piece_block b(piece, idx);

			// only allow a single additional request per block, in order
			// to spread it out evenly across all stalled blocks
			if (int(info.num_peers) > timed_out)
				continue;

			busy_blocks[busy_count].peers = info.num_peers;
			busy_blocks[busy_count].index = idx;
			++busy_count;

#if TORRENT_DEBUG_STREAMING > 1
			std::printf(" [%d (%d)]", b.block_index, info.num_peers);
#endif
		}
#if TORRENT_DEBUG_STREAMING > 1
		std::printf("\n");
#endif

		busy_blocks = busy_blocks.first(busy_count);

		// then sort blocks by the number of peers with requests
		// to the blocks (request the blocks with the fewest peers
		// first)
		std::sort(busy_blocks.begin(), busy_blocks.end());

		// then insert them into the interesting_blocks vector
		for (auto const& block : busy_blocks)
			interesting_blocks.emplace_back(piece, block.index);
	}